

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O3

void __thiscall dumper::dumproot(dumper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  roots *prVar3;
  string local_40;
  
  prVar3 = getroot(this,0);
  if (prVar3 != (roots *)0x0) {
    (*this->_vptr_dumper[4])(this,prVar3);
    uVar2 = *(prVar3->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"HKCR","");
    dumpkeys(this,uVar2 & 0xfffffff,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    uVar2 = (prVar3->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[1];
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"HKCU","");
    dumpkeys(this,uVar2 & 0xfffffff,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    uVar2 = (prVar3->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"HKLM","");
    dumpkeys(this,uVar2 & 0xfffffff,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  puts("could not find root");
  return;
}

Assistant:

void dumproot()            
    {
        ent::roots *r= getroot(0);
        if (!r) {
            printf("could not find root\n");
            return;
        }
        dumproots(r);

        dumpkeys(r->hiveid((HKEY)ent::HKCR), "HKCR");
        dumpkeys(r->hiveid((HKEY)ent::HKCU), "HKCU");
        dumpkeys(r->hiveid((HKEY)ent::HKLM), "HKLM");
    }